

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

void testing::internal::TuplePrefix<1ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<unsigned_long>,testing::Matcher<unsigned_int>>,std::tuple<unsigned_long,unsigned_int>>
               (tuple<testing::Matcher<unsigned_long>,_testing::Matcher<unsigned_int>_> *matchers,
               tuple<unsigned_long,_unsigned_int> *values,ostream *os)

{
  bool bVar1;
  ostream *poVar2;
  _Head_base<0UL,_unsigned_long,_false> *x;
  _Head_base<0UL,_testing::Matcher<unsigned_long>,_false> *this;
  type matcher;
  StringMatchResultListener listener;
  MatcherBase<unsigned_long> MStack_1e8;
  string local_1d0;
  StringMatchResultListener local_1b0;
  
  this = &(matchers->
          super__Tuple_impl<0UL,_testing::Matcher<unsigned_long>,_testing::Matcher<unsigned_int>_>).
          super__Head_base<0UL,_testing::Matcher<unsigned_long>,_false>;
  Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&MStack_1e8,&this->_M_head_impl);
  StringMatchResultListener::StringMatchResultListener(&local_1b0);
  x = &(values->super__Tuple_impl<0UL,_unsigned_long,_unsigned_int>).
       super__Head_base<0UL,_unsigned_long,_false>;
  bVar1 = MatcherBase<unsigned_long>::MatchAndExplain
                    (&MStack_1e8,&x->_M_head_impl,&local_1b0.super_MatchResultListener);
  if (!bVar1) {
    poVar2 = std::operator<<(os,"  Expected arg #");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,": ");
    MatcherBase<unsigned_long>::DescribeTo((MatcherBase<unsigned_long> *)this,os);
    std::operator<<(os,"\n           Actual: ");
    internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
    PrintValue<unsigned_long,void,std::ostream&>(&x->_M_head_impl,os);
    std::__cxx11::stringbuf::str();
    PrintIfNotEmpty(&local_1d0,os);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::operator<<(os,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener(&local_1b0);
  MatcherBase<unsigned_long>::~MatcherBase(&MStack_1e8);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename std::tuple_element<N - 1, MatcherTuple>::type matcher =
        std::get<N - 1>(matchers);
    typedef typename std::tuple_element<N - 1, ValueTuple>::type Value;
    const Value& value = std::get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      *os << "  Expected arg #" << N - 1 << ": ";
      std::get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }